

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O2

void minihttp::URLEncode(string *s,string *enc)

{
  byte bVar1;
  size_type sVar2;
  int iVar3;
  size_t i;
  size_type sVar4;
  uint uVar5;
  char buf [3];
  
  sVar2 = s->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    bVar1 = (s->_M_dataplus)._M_p[sVar4];
    uVar5 = (uint)bVar1;
    iVar3 = isalnum(uVar5);
    if ((((iVar3 == 0) && (2 < uVar5 - 0x2c)) && (bVar1 != 0x20)) && (uVar5 != 0x5f)) {
      std::__cxx11::string::append((char *)enc,(ulong)buf);
    }
    else {
      std::__cxx11::string::push_back((char)enc);
    }
  }
  return;
}

Assistant:

void URLEncode(const std::string& s, std::string& enc)
{
    const size_t len = s.length();
    char buf[3];
    buf[0] = '%';
    for(size_t i = 0; i < len; i++)
    {
        const unsigned char c = s[i];
        // from  https://www.ietf.org/rfc/rfc1738.txt, page 3
        // with some changes for compatibility
        if(isalnum(c) || c == '-' || c == '_' || c == '.' || c == ',')
            enc += (char)c;
        else if(c == ' ')
            enc += '+';
        else
        {
            unsigned nib = (c >> 4) & 0xf;
            buf[1] = nib < 10 ? '0' + nib : 'a' + (nib-10);
            nib = c & 0xf;
            buf[2] = nib < 10 ? '0' + nib : 'a' + (nib-10);
            enc.append(&buf[0], 3);
        }
    }
}